

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::EnqueueProcessedObject
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,FreeObject **list,
          FreeObject **tail,void *objectAddress,uint index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint index_local;
  void *objectAddress_local;
  FreeObject **tail_local;
  FreeObject **list_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  if (*tail == (FreeObject *)0x0) {
    if (*list != (FreeObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x67b,"(*list == nullptr)","*list == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    *tail = (FreeObject *)objectAddress;
  }
  EnqueueProcessedObject(this,list,objectAddress,index);
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::EnqueueProcessedObject(FreeObject ** list, FreeObject ** tail, void* objectAddress, uint index)
{
    if (*tail == nullptr)
    {
        Assert(*list == nullptr);
        *tail = (FreeObject *)objectAddress;
    }
    EnqueueProcessedObject(list, objectAddress, index);
}